

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_sjasm.cpp
# Opt level: O0

void dirLUA(void)

{
  lua_State *L;
  bool bVar1;
  int iVar2;
  EStatus type;
  EWStatus type_00;
  size_t sVar3;
  reference pvVar4;
  char *name;
  byte local_71;
  char *local_70;
  bool local_66;
  EWStatus warningType;
  size_t lineLen;
  undefined1 auStack_50 [4];
  int isEndLua;
  TextFilePos luaStartPos;
  bool showWarning;
  int iStack_2c;
  bool execute;
  EStatus errorType;
  int passToExec;
  char *bp;
  char *buff;
  char *id;
  size_t luaBufferSize;
  
  if (LUA == (lua_State *)0x0) {
    lua_impl_init();
  }
  if (LUA == (lua_State *)0x0) {
    __assert_fail("LUA",
                  "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/sjasm/lua_sjasm.cpp"
                  ,0x1d2,"void dirLUA()");
  }
  id = (char *)0x8000;
  bp = (char *)0x0;
  iStack_2c = 3;
  buff = GetID(&lp);
  if ((buff != (char *)0x0) && (sVar3 = strlen(buff), sVar3 != 0)) {
    iVar2 = cmphstr(&buff,"pass1",false);
    if (iVar2 == 0) {
      iVar2 = cmphstr(&buff,"pass2",false);
      if (iVar2 == 0) {
        iVar2 = cmphstr(&buff,"pass3",false);
        if (iVar2 == 0) {
          iVar2 = cmphstr(&buff,"allpass",false);
          if (iVar2 == 0) {
            Error("[LUA] Syntax error",buff,PASS3);
          }
          else {
            iStack_2c = -1;
          }
        }
        else {
          iStack_2c = 3;
        }
      }
      else {
        iStack_2c = 2;
      }
    }
    else {
      iStack_2c = 1;
    }
  }
  type = PASS3;
  if (iStack_2c == 1 || iStack_2c == 2) {
    type = EARLY;
  }
  local_66 = iStack_2c == -1 || iStack_2c == pass;
  luaStartPos._23_1_ = local_66;
  bVar1 = suppressedById(W_LUA_MC_PASS);
  luaStartPos._22_1_ = (bVar1 ^ 0xffU) & 1;
  bVar1 = std::vector<TextFilePos,_std::allocator<TextFilePos>_>::empty(&sourcePosStack);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!sourcePosStack.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/sjasm/lua_sjasm.cpp"
                  ,0x1eb,"void dirLUA()");
  }
  pvVar4 = std::vector<TextFilePos,_std::allocator<TextFilePos>_>::back(&sourcePosStack);
  _auStack_50 = pvVar4->filename;
  luaStartPos.filename = *(char **)&pvVar4->line;
  luaStartPos.line = pvVar4->colEnd;
  luaStartPos.colBegin = *(uint32_t *)&pvVar4->field_0x14;
  if ((luaStartPos._23_1_ & 1) != 0) {
    bp = (char *)operator_new__(0x8000);
  }
  ListFile(false);
  _errorType = bp;
  do {
    iVar2 = ReadLine(false);
    if (iVar2 == 0) {
      Error("[LUA] Unexpected end of lua script",(char *)0x0,PASS3);
LAB_0012c10c:
      if ((luaStartPos._23_1_ & 1) != 0) {
        extraErrorWarningPrefix = lua_err_prefix;
        *_errorType = '\0';
        DidEmitByte();
        L = LUA;
        name = lua_impl_get_script_name((TextFilePos *)auStack_50);
        iVar2 = luaL_loadbufferx(L,bp,(long)_errorType - (long)bp,name,(char *)0x0);
        if ((iVar2 != 0) || (iVar2 = lua_pcallk(LUA,0,-1,0,0,(lua_KFunction)0x0), iVar2 != 0)) {
          lua_impl_showLoadError(type);
        }
        extraErrorWarningPrefix = (char *)0x0;
        if (bp != (char *)0x0) {
          operator_delete__(bp);
        }
        bVar1 = DidEmitByte();
        if (((bVar1) && (iStack_2c != -1)) && ((luaStartPos._22_1_ & 1) != 0)) {
          type_00 = W_PASS3;
          if (iStack_2c == 1 || iStack_2c == 2) {
            type_00 = W_EARLY;
          }
          WarningById(W_LUA_MC_PASS,(char *)0x0,type_00);
        }
      }
      CompiledCurrentLine = CompiledCurrentLine + 1;
      substitutedLine = line;
      return;
    }
    lp = line;
    SkipBlanks(&lp);
    iVar2 = cmphstr(&lp,"endlua",false);
    if (iVar2 == 0) {
      local_70 = (char *)strlen(line);
    }
    else {
      local_70 = lp + -0x1e1bb6;
    }
    if ((luaStartPos._23_1_ & 1) != 0) {
      if ((char *)0x8000 < local_70 + (long)(_errorType + (4 - (long)bp))) {
        ErrorInt("[LUA] Maximum byte-size of Lua script is",0x7ffc,FATAL);
      }
      memcpy(_errorType,line,(size_t)local_70);
      local_70 = local_70 + (long)_errorType;
      _errorType = local_70 + 1;
      *local_70 = '\n';
    }
    if (iVar2 != 0) {
      pvVar4 = std::vector<TextFilePos,_std::allocator<TextFilePos>_>::back(&sourcePosStack);
      skipEmitMessagePos.filename = pvVar4->filename;
      skipEmitMessagePos.line = pvVar4->line;
      skipEmitMessagePos.colBegin = pvVar4->colBegin;
      skipEmitMessagePos.colEnd = pvVar4->colEnd;
      CompiledCurrentLine = CompiledCurrentLine + 1;
      lp = ReplaceDefine(lp);
      substitutedLine = line;
      local_71 = 0;
      if ((luaStartPos._22_1_ & 1) != 0) {
        bVar1 = suppressedById(W_LUA_MC_PASS);
        local_71 = bVar1 ^ 0xff;
      }
      luaStartPos._22_1_ = local_71 & 1;
      goto LAB_0012c10c;
    }
    ListFile(true);
  } while( true );
}

Assistant:

void dirLUA() {
	// lazy init of Lua scripting upon first hit of LUA directive
	if (nullptr == LUA) lua_impl_init();
	assert(LUA);

	constexpr size_t luaBufferSize = 32768;
	char* id, * buff = nullptr, * bp = nullptr;

	int passToExec = LASTPASS;
	if ((id = GetID(lp)) && strlen(id) > 0) {
		if (cmphstr(id, "pass1")) {
			passToExec = 1;
		} else if (cmphstr(id, "pass2")) {
			passToExec = 2;
		} else if (cmphstr(id, "pass3")) {
			passToExec = LASTPASS;
		} else if (cmphstr(id, "allpass")) {
			passToExec = -1;
		} else {
			Error("[LUA] Syntax error", id);
		}
	}

	const EStatus errorType = (1 == passToExec || 2 == passToExec) ? EARLY : PASS3;
	const bool execute = (-1 == passToExec) || (passToExec == pass);
	// remember warning suppression also from block start
	bool showWarning = !suppressedById(W_LUA_MC_PASS);

	assert(!sourcePosStack.empty());
	TextFilePos luaStartPos = sourcePosStack.back();	// position of LUA directive (not ENDLUA)
	if (execute) {
		buff = new char[luaBufferSize];
		bp = buff;
	}
	ListFile();

	while (1) {
		if (!ReadLine(false)) {
			Error("[LUA] Unexpected end of lua script");
			break;
		}
		lp = line;
		SkipBlanks(lp);
		const int isEndLua = cmphstr(lp, "endlua");
		const size_t lineLen = isEndLua ? (lp - 6 - line) : strlen(line);
		if (execute) {
			if (luaBufferSize < (bp - buff) + lineLen + 4) {
				ErrorInt("[LUA] Maximum byte-size of Lua script is", luaBufferSize-4, FATAL);
			}
			memcpy(bp, line, lineLen);
			bp += lineLen;
			*bp++ = '\n';
		}
		if (isEndLua) {		// eat also any trailing eol-type of comment
			skipEmitMessagePos = sourcePosStack.back();
			++CompiledCurrentLine;
			lp = ReplaceDefine(lp);		// skip any empty substitutions and comments
			substitutedLine = line;		// override substituted listing for ENDLUA
			// take into account also warning suppression used at end of block
			showWarning = showWarning && !suppressedById(W_LUA_MC_PASS);
			break;
		}
		ListFile(true);
	}

	if (execute) {
		extraErrorWarningPrefix = lua_err_prefix;
		*bp = 0;
		DidEmitByte();			// reset the flag before running lua script
		if (luaL_loadbuffer(LUA, buff, bp-buff, lua_impl_get_script_name(luaStartPos)) || lua_pcall(LUA, 0, LUA_MULTRET, 0)) {
			lua_impl_showLoadError(errorType);
		}
		extraErrorWarningPrefix = nullptr;
		delete[] buff;
		if (DidEmitByte() && (-1 != passToExec) && showWarning) {
			const EWStatus warningType = (1 == passToExec || 2 == passToExec) ? W_EARLY : W_PASS3;
			WarningById(W_LUA_MC_PASS, nullptr, warningType);
		}
	}

	++CompiledCurrentLine;
	substitutedLine = line;		// override substituted list line for ENDLUA
}